

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cortex.cpp
# Opt level: O3

int Initialize_ListenForReplies(void)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (CommandSocket == -1) {
    iVar2 = 0;
    LogMessage(4,"Creating Socket for commands");
    CommandSocket = Socket_CreateForBroadcasting((ulong)MyNicCardAddress.s_addr,wMyPort);
    if (CommandSocket == -1) {
      LogMessage(1,"Unable to initialize SDK Sockets.");
      iVar2 = 3;
    }
    else {
      iVar1 = pthread_create(&CortexListenThread_ID,(pthread_attr_t *)0x0,CortexListenThread_Func,
                             (void *)0x0);
      if (iVar1 != 0) {
        iVar2 = 0;
        LogMessage(1,"%s: pthread_create error starting CortexListenThread thread",
                   "int Initialize_ListenForReplies()");
      }
    }
  }
  return iVar2;
}

Assistant:

LOCAL int Initialize_ListenForReplies()
{
  if (CommandSocket != -1) {
    return OK;
  }
  LogMessage(VL_Debug, "Creating Socket for commands");
  CommandSocket
      = Socket_CreateForBroadcasting(MyNicCardAddress.s_addr, wMyPort);

  if (CommandSocket == -1) {
    LogMessage(VL_Error, "Unable to initialize SDK Sockets.");
    return RC_NetworkError;
  }

  int status = pthread_create(&CortexListenThread_ID, NULL,
                              CortexListenThread_Func, NULL);
  if (status != 0) {
    LogMessage(VL_Error,
               "%s: pthread_create error starting CortexListenThread thread",
               __PRETTY_FUNCTION__);
  }

  return OK;
}